

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O0

void __thiscall
rsg::ShaderInput::ShaderInput(ShaderInput *this,Variable *variable,ConstValueRangeAccess valueRange)

{
  int iVar1;
  VariableType *pVVar2;
  reference pvVar3;
  StridedValueAccess<1> local_90;
  ConstValueAccess local_80;
  StridedValueRead<1> local_70;
  StridedValueAccess<1> local_60;
  ConstValueAccess local_50;
  StridedValueRead<1> local_40;
  allocator<rsg::Scalar> local_2d [20];
  allocator<rsg::Scalar> local_19;
  Variable *local_18;
  Variable *variable_local;
  ShaderInput *this_local;
  
  this->m_variable = variable;
  local_18 = variable;
  variable_local = (Variable *)this;
  pVVar2 = rsg::Variable::getType(variable);
  iVar1 = VariableType::getScalarSize(pVVar2);
  std::allocator<rsg::Scalar>::allocator(&local_19);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_min,(long)iVar1,&local_19)
  ;
  std::allocator<rsg::Scalar>::~allocator(&local_19);
  pVVar2 = rsg::Variable::getType(local_18);
  iVar1 = VariableType::getScalarSize(pVVar2);
  std::allocator<rsg::Scalar>::allocator(local_2d);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_max,(long)iVar1,local_2d);
  std::allocator<rsg::Scalar>::~allocator(local_2d);
  local_50 = ConstValueRangeAccess::getMin(&valueRange);
  local_40 = ConstStridedValueAccess<1>::value(&local_50);
  pVVar2 = rsg::Variable::getType(local_18);
  pvVar3 = std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator[](&this->m_min,0);
  StridedValueAccess<1>::StridedValueAccess(&local_60,pVVar2,pvVar3);
  StridedValueAccess<1>::operator=(&local_60,&local_40);
  local_80 = ConstValueRangeAccess::getMax(&valueRange);
  local_70 = ConstStridedValueAccess<1>::value(&local_80);
  pVVar2 = rsg::Variable::getType(local_18);
  pvVar3 = std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::operator[](&this->m_max,0);
  StridedValueAccess<1>::StridedValueAccess(&local_90,pVVar2,pvVar3);
  StridedValueAccess<1>::operator=(&local_90,&local_70);
  return;
}

Assistant:

ShaderInput::ShaderInput (const Variable* variable, ConstValueRangeAccess valueRange)
	: m_variable	(variable)
	, m_min			(variable->getType().getScalarSize())
	, m_max			(variable->getType().getScalarSize())
{
	ValueAccess(variable->getType(), &m_min[0]) = valueRange.getMin().value();
	ValueAccess(variable->getType(), &m_max[0]) = valueRange.getMax().value();
}